

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::UniformCase::UniformCase
          (UniformCase *this,Context *context,char *name,char *description,deUint32 seed)

{
  StructType *this_00;
  UniformCase *pUVar1;
  long *name_;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  UniformCollection *this_01;
  long *plVar6;
  SharedPtrStateBase *pSVar7;
  long *plVar8;
  long lVar9;
  vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> structTypes;
  int structIdx;
  Random rnd;
  Uniform uniform;
  vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> local_278;
  UniformCase *local_258;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  deUint32 local_22c;
  uint local_228;
  int local_224;
  long *local_220 [2];
  long local_210 [2];
  CallLogWrapper *local_200;
  SharedPtr<const_deqp::gles3::Functional::(anonymous_namespace)::UniformCollection> *local_1f8;
  deRandom local_1f0;
  Uniform local_1e0;
  VarType local_1a8 [4];
  ios_base local_138 [264];
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,description);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformCase_02186270;
  iVar2 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  local_200 = &this->super_CallLogWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (local_200,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformCase_02186270;
  dVar3 = randomFeatures(seed);
  *(deUint32 *)&(this->super_CallLogWrapper).field_0x14 = dVar3;
  deRandom_init(&local_1f0,seed);
  dVar3 = deRandom_getUint32(&local_1f0);
  local_224 = 0;
  this_01 = (UniformCollection *)operator_new(0x30);
  local_1f8 = &this->m_uniformCollection;
  local_228 = dVar3 % 5;
  (this_01->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_01->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_01->m_uniforms).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_01->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->m_uniforms).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->m_uniforms).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar2 = 0;
  local_258 = this;
  local_22c = seed;
  do {
    local_278.super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_278.super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_278.super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,iVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)local_220,0,(char *)0x0,0x1c0ba4c);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_240 = *plVar8;
      lStack_238 = plVar6[3];
      local_250 = &local_240;
    }
    else {
      local_240 = *plVar8;
      local_250 = (long *)*plVar6;
    }
    name_ = local_250;
    local_248 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    glu::VarType::VarType(local_1a8);
    anon_unknown_1::Uniform::Uniform(&local_1e0,(char *)name_,local_1a8);
    glu::VarType::~VarType(local_1a8);
    if (local_250 != &local_240) {
      operator_delete(local_250,local_240 + 1);
    }
    if (local_220[0] != local_210) {
      operator_delete(local_220[0],local_210[0] + 1);
    }
    do {
      if (0 < (int)((ulong)((long)local_278.
                                  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_278.
                                 super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
        lVar9 = 0;
        do {
          this_00 = local_278.
                    super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar9];
          if (this_00 != (StructType *)0x0) {
            glu::StructType::~StructType(this_00);
            operator_delete(this_00,0x38);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < (int)((ulong)((long)local_278.
                                             super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_278.
                                            super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      pUVar1 = local_258;
      if (local_278.
          super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_278.
          super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_278.
        super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_278.
             super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_220,0,(char *)0x0,0x1c0ba4c);
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_240 = *plVar8;
        lStack_238 = plVar6[3];
        local_250 = &local_240;
      }
      else {
        local_240 = *plVar8;
        local_250 = (long *)*plVar6;
      }
      local_248 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      generateRandomType(local_1a8,3,&local_224,&local_278,(Random *)&local_1f0);
      glu::VarType::operator=(&local_1e0.type,local_1a8);
      glu::VarType::~VarType(local_1a8);
      if (local_250 != &local_240) {
        operator_delete(local_250,local_240 + 1);
      }
      if (local_220[0] != local_210) {
        operator_delete(local_220[0],local_210[0] + 1);
      }
      iVar4 = anon_unknown_1::UniformCollection::getNumSamplers(this_01);
      iVar5 = getNumSamplersInType(&local_1e0.type);
    } while (0x10 < iVar5 + iVar4);
    anon_unknown_1::UniformCollection::addUniform(this_01,&local_1e0);
    if (0 < (int)((ulong)((long)local_278.
                                super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_278.
                               super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      lVar9 = 0;
      do {
        anon_unknown_1::UniformCollection::addStructType
                  (this_01,local_278.
                           super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar9]);
        lVar9 = lVar9 + 1;
      } while (lVar9 < (int)((ulong)((long)local_278.
                                           super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_278.
                                          super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3));
    }
    glu::VarType::~VarType(&local_1e0.type);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0.name._M_dataplus._M_p != &local_1e0.name.field_2) {
      operator_delete(local_1e0.name._M_dataplus._M_p,
                      local_1e0.name.field_2._M_allocated_capacity + 1);
    }
    if (local_278.
        super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_278.
                      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_278.
                            super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_278.
                            super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 <= (int)local_228);
  local_1f8->m_ptr = (UniformCollection *)0x0;
  local_1f8->m_state = (SharedPtrStateBase *)0x0;
  (pUVar1->m_uniformCollection).m_ptr = this_01;
  pSVar7 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar7->strongRefCount = 0;
  pSVar7->weakRefCount = 0;
  pSVar7->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021866c8;
  pSVar7[1]._vptr_SharedPtrStateBase = (_func_int **)this_01;
  (pUVar1->m_uniformCollection).m_state = pSVar7;
  pSVar7->strongRefCount = 1;
  pSVar7->weakRefCount = 1;
  deRandom_init((deRandom *)local_1a8,local_22c);
  dVar3 = deRandom_getUint32((deRandom *)local_1a8);
  pUVar1->m_caseShaderType = dVar3 % 3;
  (pUVar1->m_textures2d).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pUVar1->m_textures2d).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pUVar1->m_textures2d).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pUVar1->m_texturesCube).
  super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pUVar1->m_texturesCube).
  super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pUVar1->m_texturesCube).
  super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pUVar1->m_filledTextureUnits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pUVar1->m_filledTextureUnits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pUVar1->m_filledTextureUnits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

UniformCase::UniformCase (Context& context, const char* name, const char* description, const deUint32 seed)
	: TestCase				(context, name, description)
	, CallLogWrapper		(context.getRenderContext().getFunctions(), m_testCtx.getLog())
	, m_features			(randomFeatures(seed))
	, m_uniformCollection	(UniformCollection::random(seed))
	, m_caseShaderType		(randomCaseShaderType(seed))
{
}